

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.hpp
# Opt level: O0

bool __thiscall
diy::detail::KDTreePartners::active(KDTreePartners *this,int round,int gid,Master *m)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Master *in_RCX;
  int in_EDX;
  int in_ESI;
  RegularAllReducePartners *in_RDI;
  int in_stack_ffffffffffffffbc;
  KDTreePartners *in_stack_ffffffffffffffc0;
  Master *m_00;
  undefined8 in_stack_ffffffffffffffc8;
  pointer *this_00;
  bool local_1;
  
  sVar3 = rounds((KDTreePartners *)0x1a813d);
  if (in_ESI == (int)sVar3) {
    local_1 = true;
  }
  else {
    bVar1 = swap_round(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if ((bVar1) &&
       (iVar2 = sub_round(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc), iVar2 < 0)) {
      local_1 = true;
    }
    else {
      bVar1 = swap_round(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      if (bVar1) {
        this_00 = &in_RDI[4].super_RegularMergePartners.super_RegularPartners.kvs_.
                   super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        iVar2 = sub_round(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        local_1 = RegularSwapPartners::active((RegularSwapPartners *)this_00,iVar2,in_EDX,in_RCX);
      }
      else {
        m_00 = (Master *)
               &in_RDI[3].super_RegularMergePartners.super_RegularPartners.kvs_.
                super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        sub_round((KDTreePartners *)m_00,in_stack_ffffffffffffffbc);
        local_1 = RegularAllReducePartners::active
                            (in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                             (int)in_stack_ffffffffffffffc8,m_00);
      }
    }
  }
  return local_1;
}

Assistant:

inline bool   active(int round, int gid, const diy::Master& m) const
  {
    if (round == (int) rounds())
        return true;
    else if (swap_round(round) && sub_round(round) < 0)     // link round
        return true;
    else if (swap_round(round))
        return swap.active(sub_round(round), gid, m);
    else
        return histogram.active(sub_round(round), gid, m);
  }